

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotate_at(vec4 *m,float *pivot,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  __m128 m2;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  __m128 m0;
  float fVar25;
  float fVar26;
  __m128 m1;
  float fVar27;
  float fVar28;
  
  fVar1 = *pivot;
  fVar2 = pivot[1];
  fVar3 = pivot[2];
  fVar9 = m[2][1];
  fVar10 = m[2][2];
  fVar15 = m[2][3];
  fVar13 = m[3][1];
  fVar11 = m[3][2];
  fVar12 = m[3][3];
  fVar17 = m[1][1];
  fVar18 = m[1][2];
  fVar4 = m[1][3];
  fVar5 = (*m)[1];
  fVar6 = (*m)[2];
  fVar7 = (*m)[3];
  m[3][0] = (*m)[0] * fVar1 + m[1][0] * fVar2 + m[2][0] * fVar3 + m[3][0];
  m[3][1] = fVar5 * fVar1 + fVar17 * fVar2 + fVar9 * fVar3 + fVar13;
  m[3][2] = fVar6 * fVar1 + fVar18 * fVar2 + fVar10 * fVar3 + fVar11;
  m[3][3] = fVar7 * fVar1 + fVar4 * fVar2 + fVar15 * fVar3 + fVar12;
  fVar9 = cosf(angle);
  fVar10 = axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1];
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar15 = 0.0;
  if (fVar10 < 1.1920929e-07) {
    fVar13 = 0.0;
    fVar10 = 0.0;
  }
  else {
    fVar10 = 1.0 / fVar10;
    fVar15 = *axis * fVar10;
    fVar13 = fVar10 * (float)*(undefined8 *)(axis + 1);
    fVar10 = fVar10 * (float)((ulong)*(undefined8 *)(axis + 1) >> 0x20);
  }
  fVar11 = 1.0 - fVar9;
  fVar17 = fVar11 * fVar15;
  fVar18 = fVar11 * fVar13;
  fVar11 = fVar11 * fVar10;
  fVar12 = sinf(angle);
  fVar20 = fVar15 * fVar18 - fVar12 * fVar10;
  fVar14 = fVar13 * fVar17 + fVar12 * fVar10;
  fVar27 = fVar15 * fVar11 + fVar13 * fVar12;
  fVar21 = fVar17 * fVar10 - fVar13 * fVar12;
  fVar28 = fVar13 * fVar11 - fVar15 * fVar12;
  fVar25 = fVar18 * fVar10 + fVar15 * fVar12;
  fVar19 = fVar15 * fVar17 + fVar9;
  fVar16 = fVar13 * fVar18 + fVar9;
  fVar9 = fVar11 * fVar10 + fVar9;
  fVar10 = (*m)[0];
  fVar15 = (*m)[1];
  fVar13 = (*m)[2];
  fVar11 = (*m)[3];
  fVar12 = m[1][0];
  fVar17 = m[1][1];
  fVar18 = m[1][2];
  fVar4 = m[1][3];
  fVar5 = m[2][0];
  fVar6 = m[2][1];
  fVar7 = m[2][2];
  fVar8 = m[2][3];
  fVar22 = fVar21 * fVar5 + fVar14 * fVar12 + fVar19 * fVar10;
  fVar23 = fVar21 * fVar6 + fVar14 * fVar17 + fVar19 * fVar15;
  fVar24 = fVar21 * fVar7 + fVar14 * fVar18 + fVar19 * fVar13;
  fVar14 = fVar21 * fVar8 + fVar14 * fVar4 + fVar19 * fVar11;
  fVar19 = fVar25 * fVar5 + fVar16 * fVar12 + fVar20 * fVar10;
  fVar21 = fVar25 * fVar6 + fVar16 * fVar17 + fVar20 * fVar15;
  fVar26 = fVar25 * fVar7 + fVar16 * fVar18 + fVar20 * fVar13;
  fVar16 = fVar25 * fVar8 + fVar16 * fVar4 + fVar20 * fVar11;
  fVar12 = fVar9 * fVar5 + fVar28 * fVar12 + fVar27 * fVar10;
  fVar17 = fVar9 * fVar6 + fVar28 * fVar17 + fVar27 * fVar15;
  fVar18 = fVar9 * fVar7 + fVar28 * fVar18 + fVar27 * fVar13;
  fVar11 = fVar9 * fVar8 + fVar28 * fVar4 + fVar27 * fVar11;
  fVar9 = m[3][0];
  fVar10 = m[3][1];
  fVar15 = m[3][2];
  fVar13 = m[3][3];
  (*m)[0] = fVar22;
  (*m)[1] = fVar23;
  (*m)[2] = fVar24;
  (*m)[3] = fVar14;
  m[1][0] = fVar19;
  m[1][1] = fVar21;
  m[1][2] = fVar26;
  m[1][3] = fVar16;
  m[2][0] = fVar12;
  m[2][1] = fVar17;
  m[2][2] = fVar18;
  m[2][3] = fVar11;
  m[3][0] = ((fVar9 - fVar3 * fVar12) - fVar2 * fVar19) - fVar1 * fVar22;
  m[3][1] = ((fVar10 - fVar3 * fVar17) - fVar2 * fVar21) - fVar1 * fVar23;
  m[3][2] = ((fVar15 - fVar3 * fVar18) - fVar2 * fVar26) - fVar1 * fVar24;
  m[3][3] = ((fVar13 - fVar3 * fVar11) - fVar2 * fVar16) - fVar1 * fVar14;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotate_at(m, pivot, angle, axis);
}